

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void CreateDefaultArgumentFunctionWrappers(ExpressionContext *ctx)

{
  FunctionData *function;
  TypeBase *pTVar1;
  uint uVar2;
  int iVar3;
  ExprBase *pEVar4;
  ulong uVar5;
  Node *pNVar6;
  ulong uVar7;
  ArgumentData *pAVar8;
  InplaceStr functionName;
  DirectChainedMap<FunctionData_*> valueFunctions;
  TraceScope traceScope;
  DirectChainedMap<FunctionData_*> local_60;
  ulong local_48;
  TraceScope local_40;
  
  if ((CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token)
     , iVar3 != 0)) {
    CreateDefaultArgumentFunctionWrappers::token =
         NULLC::TraceGetToken("analyze","CreateDefaultArgumentFunctionWrappers");
    __cxa_guard_release(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,CreateDefaultArgumentFunctionWrappers::token);
  DirectChainedMap<FunctionData_*>::DirectChainedMap(&local_60,ctx->allocator);
  if ((ctx->functions).count != 0) {
    uVar5 = 0;
    do {
      function = (ctx->functions).data[uVar5];
      local_48 = uVar5;
      if ((function->importModule == (ModuleData *)0x0) &&
         ((((function->scope == ctx->globalScope || (function->scope->ownerType != (TypeBase *)0x0))
           && (function->isHidden == false)) && ((function->arguments).count != 0)))) {
        uVar5 = 0;
        do {
          pAVar8 = (function->arguments).data;
          pEVar4 = pAVar8[uVar5].value;
          if (pEVar4 != (ExprBase *)0x0) {
            pAVar8 = pAVar8 + uVar5;
            if (pAVar8->valueFunction != (FunctionData *)0x0) {
              __assert_fail("argument.valueFunction == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x3446,
                            "void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)");
            }
            pTVar1 = pEVar4->type;
            if (pTVar1 != (TypeBase *)0x0) {
              if (pTVar1->typeID == 0) goto LAB_0018be89;
              if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x1a)) {
                pEVar4 = CreateCast(ctx,pAVar8->source,pEVar4,pAVar8->type,true);
              }
            }
            functionName = GetDefaultArgumentWrapperFunctionName(ctx,function,pAVar8->name->name);
            uVar2 = NULLC::GetStringHash(functionName.begin,functionName.end);
            uVar7 = (ulong)(local_60.bucketCount - 1 & uVar2);
            if (*(long *)(local_60.data + uVar7 * 0x18 + 0x10) != 0) {
              pNVar6 = local_60.data + uVar7 * 0x18;
              do {
                if (pNVar6 == (Node *)0x0) break;
                if (*(uint *)pNVar6 == uVar2) {
                  pNVar6 = pNVar6 + 8;
                  goto LAB_0018be7d;
                }
                pNVar6 = *(Node **)(pNVar6 + 0x10);
              } while (pNVar6 != local_60.data + uVar7 * 0x18);
            }
            pNVar6 = (Node *)0x0;
LAB_0018be7d:
            if (pNVar6 == (Node *)0x0) {
              pEVar4 = CreateValueFunctionWrapper
                                 (ctx,pAVar8->source,(SynBase *)0x0,pEVar4,functionName);
              if (pEVar4 == (ExprBase *)0x0) {
LAB_0018bf65:
                __assert_fail("isType<ExprFunctionAccess>(access)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x345d,
                              "void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)");
              }
              if (pEVar4->typeID != 0) {
                if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 0x26)) goto LAB_0018bf65;
                if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 0x26)) {
                  pEVar4 = (ExprBase *)0x0;
                }
                if (pEVar4 != (ExprBase *)0x0) {
                  pAVar8->valueFunction = (FunctionData *)pEVar4[1]._vptr_ExprBase;
                  uVar2 = NULLC::GetStringHash(functionName.begin,functionName.end);
                  DirectChainedMap<FunctionData_*>::insert
                            (&local_60,uVar2,(FunctionData *)pEVar4[1]._vptr_ExprBase);
                }
              }
            }
            else {
              pAVar8->valueFunction = *(FunctionData **)pNVar6;
            }
          }
LAB_0018be89:
          uVar5 = uVar5 + 1;
        } while (uVar5 < (function->arguments).count);
      }
      uVar5 = local_48 + 1;
    } while (uVar5 < (ctx->functions).count);
  }
  (*(local_60.allocator)->_vptr_Allocator[3])(local_60.allocator,local_60.data);
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void CreateDefaultArgumentFunctionWrappers(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "CreateDefaultArgumentFunctionWrappers");

	DirectChainedMap<FunctionData*> valueFunctions(ctx.allocator);

	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		if(function->importModule)
			continue;

		// Handle only global visible functions
		if(function->scope != ctx.globalScope && !function->scope->ownerType)
			continue;

		if(function->isHidden)
			continue;

		// Go through all function arguments
		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			if(argument.value)
			{
				assert(argument.valueFunction == NULL);

				ExprBase *value = argument.value;

				if(isType<TypeError>(value->type))
					continue;

				if(isType<TypeFunctionSet>(value->type))
					value = CreateCast(ctx, argument.source, argument.value, argument.type, true);

				InplaceStr functionName = GetDefaultArgumentWrapperFunctionName(ctx, function, argument.name->name);

				if(FunctionData **valueFunction = valueFunctions.find(functionName.hash()))
				{
					argument.valueFunction = *valueFunction;
					continue;
				}

				ExprBase *access = CreateValueFunctionWrapper(ctx, argument.source, NULL, value, functionName);

				if(isType<ExprError>(access))
					continue;

				assert(isType<ExprFunctionAccess>(access));

				if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(access))
				{
					argument.valueFunction = expr->function;

					valueFunctions.insert(functionName.hash(), expr->function);
				}
			}
		}
	}
}